

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecoration
          (DecorationManager *this,uint32_t inst_id,uint32_t decoration)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Operand *local_128;
  allocator<spvtools::opt::Operand> local_11d;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  uint32_t local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  Operand OStack_70;
  iterator local_40;
  _func_int **local_38;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_30;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t decoration_local;
  uint32_t inst_id_local;
  DecorationManager *this_local;
  
  local_d8 = &local_dc;
  local_d0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_d8;
  local_dc = inst_id;
  local_18 = decoration;
  local_14 = inst_id;
  _decoration_local = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list_00);
  Operand::Operand(&local_a0,SPV_OPERAND_TYPE_ID,&local_c8);
  local_11c = local_18;
  local_118 = &local_11c;
  local_110 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_118;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
  Operand::Operand(&OStack_70,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_108);
  local_40 = &local_a0;
  local_38 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_11d);
  __l._M_len = (size_type)local_38;
  __l._M_array = local_40;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_30,__l,&local_11d);
  AddDecoration(this,OpDecorate,&local_30);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_30);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_11d);
  local_128 = (Operand *)&local_40;
  do {
    local_128 = local_128 + -1;
    Operand::~Operand(local_128);
  } while (local_128 != &local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
  return;
}

Assistant:

void DecorationManager::AddDecoration(uint32_t inst_id, uint32_t decoration) {
  AddDecoration(
      spv::Op::OpDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}}});
}